

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_widgets.h
# Opt level: O2

ustring * __thiscall dlib::tooltip::utext_abi_cxx11_(ustring *__return_storage_ptr__,tooltip *this)

{
  data *pdVar1;
  allocator<unsigned_int> local_49;
  auto_mutex M;
  ustring temp;
  
  M.r = (this->super_mouse_over_event).super_drawable.m;
  M.m = (mutex *)0x0;
  M.rw = (read_write_mutex *)0x0;
  rmutex::lock(M.r,1);
  temp._M_dataplus._M_p = (pointer)&temp.field_2;
  temp._M_string_length = 0;
  temp.field_2._M_local_buf[0] = 0;
  pdVar1 = (this->stuff)._M_t.
           super___uniq_ptr_impl<dlib::tooltip::data,_std::default_delete<dlib::tooltip::data>_>.
           _M_t.
           super__Tuple_impl<0UL,_dlib::tooltip::data_*,_std::default_delete<dlib::tooltip::data>_>.
           super__Head_base<0UL,_dlib::tooltip::data_*,_false>._M_head_impl;
  if (pdVar1 != (data *)0x0) {
    std::__cxx11::
    basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
    _M_assign(&temp,&(pdVar1->win).text);
  }
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  basic_string(__return_storage_ptr__,temp._M_dataplus._M_p,&local_49);
  std::__cxx11::
  basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>::
  ~basic_string(&temp);
  auto_mutex::~auto_mutex(&M);
  return __return_storage_ptr__;
}

Assistant:

const dlib::ustring utext (
        ) const
        {
            auto_mutex M(m);
            dlib::ustring temp;
            if (stuff)
            {
                temp = stuff->win.text;
            }
            return temp.c_str();
        }